

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LocalVariableDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LocalVariableDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::DataTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DataTypeSyntax *args_2,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_3,Token *args_4)

{
  Token var;
  LocalVariableDeclarationSyntax *pLVar1;
  DataTypeSyntax *in_RCX;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RDX;
  LocalVariableDeclarationSyntax *in_RSI;
  undefined8 in_RDI;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_R8;
  Info *unaff_retaddr;
  Token in_stack_00000010;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pLVar1 = (LocalVariableDeclarationSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  var.info = unaff_retaddr;
  var.kind = (short)in_RDI;
  var._2_1_ = (char)((ulong)in_RDI >> 0x10);
  var.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  var.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::LocalVariableDeclarationSyntax::LocalVariableDeclarationSyntax
            (in_RSI,in_RDX,var,in_RCX,in_R8,in_stack_00000010);
  return pLVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }